

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINFree(void **kinmem)

{
  long lVar1;
  long *in_RDI;
  KINMem kin_mem;
  
  if (*in_RDI != 0) {
    lVar1 = *in_RDI;
    KINFreeVectors((KINMem)0x10f12d);
    if (*(long *)(lVar1 + 0x248) != 0) {
      (**(code **)(lVar1 + 0x248))(lVar1);
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void KINFree(void** kinmem)
{
  KINMem kin_mem;

  if (*kinmem == NULL) { return; }

  kin_mem = (KINMem)(*kinmem);
  KINFreeVectors(kin_mem);

  /* call lfree if non-NULL */

  if (kin_mem->kin_lfree != NULL) { kin_mem->kin_lfree(kin_mem); }

  free(*kinmem);
  *kinmem = NULL;
}